

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
::initPrograms(QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderTestInstance>
               *this,SourceCollections *sourceCollections)

{
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  VkPrimitiveTopology *inputType;
  VkPrimitiveTopology *outputType;
  VkPrimitiveTopology *this_00;
  allocator<char> local_371;
  string local_370;
  undefined1 local_350 [40];
  string local_328;
  ostringstream source_te;
  string local_300 [368];
  ostringstream source;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar3 = std::operator<<((ostream *)&source,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in highp vec4 in_position;\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 1) in vec4 in_color;\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 out_color;\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"\tgl_Position = in_position;\n");
  poVar3 = std::operator<<(poVar3,"\tout_color = in_color;\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_350,"vertex",(allocator<char> *)&local_328);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,(string *)local_350);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)&source_te,&local_370);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&source_te);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)local_350);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  uVar1 = (this->m_parametersGraphic).queryStatisticFlags;
  if ((uVar1 & 0x300) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar3 = std::operator<<((ostream *)&source,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
    poVar3 = std::operator<<(poVar3,"layout(vertices = 4) out;\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) in vec4 in_color[];\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 out_color[];\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\tif( gl_InvocationID == 0 )\n");
    poVar3 = std::operator<<(poVar3,"\t{\n");
    poVar3 = std::operator<<(poVar3,"\t\tgl_TessLevelInner[0] = 4.0f;\n");
    poVar3 = std::operator<<(poVar3,"\t\tgl_TessLevelInner[1] = 4.0f;\n");
    poVar3 = std::operator<<(poVar3,"\t\tgl_TessLevelOuter[0] = 4.0f;\n");
    poVar3 = std::operator<<(poVar3,"\t\tgl_TessLevelOuter[1] = 4.0f;\n");
    poVar3 = std::operator<<(poVar3,"\t\tgl_TessLevelOuter[2] = 4.0f;\n");
    poVar3 = std::operator<<(poVar3,"\t\tgl_TessLevelOuter[3] = 4.0f;\n");
    poVar3 = std::operator<<(poVar3,"\t}\n");
    poVar3 = std::operator<<(poVar3,"\tout_color[gl_InvocationID] = in_color[gl_InvocationID];\n");
    poVar3 = std::operator<<(poVar3,
                             "\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                            );
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_350,"tessellation_control",(allocator<char> *)&local_328);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&sourceCollections->glslSources,(string *)local_350);
    std::__cxx11::stringbuf::str();
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&source_te,&local_370);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&source_te);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&source_te);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar3 = std::operator<<((ostream *)&source_te,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
    poVar3 = std::operator<<(poVar3,"layout( quads, equal_spacing, ccw ) in;\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) in vec4 in_color[];\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 out_color;\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\tconst float u = gl_TessCoord.x;\n");
    poVar3 = std::operator<<(poVar3,"\tconst float v = gl_TessCoord.y;\n");
    poVar3 = std::operator<<(poVar3,"\tconst float w = gl_TessCoord.z;\n");
    poVar3 = std::operator<<(poVar3,
                             "\tgl_Position = (1 - u) * (1 - v) * gl_in[0].gl_Position +(1 - u) * v * gl_in[1].gl_Position + u * (1 - v) * gl_in[2].gl_Position + u * v * gl_in[3].gl_Position;\n"
                            );
    poVar3 = std::operator<<(poVar3,"\tout_color = in_color[0];\n");
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"tessellation_evaluation",&local_371);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&sourceCollections->glslSources,&local_370);
    std::__cxx11::stringbuf::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_350,&local_328);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_350);
    std::__cxx11::string::~string((string *)(local_350 + 8));
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source_te);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
    uVar1 = (this->m_parametersGraphic).queryStatisticFlags;
  }
  if ((uVar1 & 0x78) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
    poVar3 = std::operator<<((ostream *)&source,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(");
    this_00 = &(this->m_parametersGraphic).primitiveTopology;
    QueryPool::(anonymous_namespace)::inputTypeToGLString_abi_cxx11_
              ((string *)&source_te,(_anonymous_namespace_ *)this_00,inputType);
    poVar3 = std::operator<<(poVar3,(string *)&source_te);
    poVar3 = std::operator<<(poVar3,") in;\n");
    poVar3 = std::operator<<(poVar3,"layout(");
    QueryPool::(anonymous_namespace)::outputTypeToGLString_abi_cxx11_
              ((string *)local_350,(_anonymous_namespace_ *)this_00,outputType);
    poVar3 = std::operator<<(poVar3,(string *)local_350);
    poVar3 = std::operator<<(poVar3,", max_vertices = 16) out;\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) in vec4 in_color[];\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 out_color;\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\tout_color = in_color[0];\n");
    poVar3 = std::operator<<(poVar3,"\tgl_Position = gl_in[0].gl_Position;\n");
    poVar3 = std::operator<<(poVar3,"\tEmitVertex();\n");
    poVar3 = std::operator<<(poVar3,"\tEndPrimitive();\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\tout_color = in_color[0];\n");
    poVar3 = std::operator<<(poVar3,"\tgl_Position = vec4(1.0, 1.0, 1.0, 1.0);\n");
    poVar3 = std::operator<<(poVar3,"\tEmitVertex();\n");
    poVar3 = std::operator<<(poVar3,"\tout_color = in_color[0];\n");
    pcVar2 = "\tgl_Position = vec4(-1.0, -1.0, 1.0, 1.0);\n";
    poVar3 = std::operator<<(poVar3,"\tgl_Position = vec4(-1.0, -1.0, 1.0, 1.0);\n");
    poVar3 = std::operator<<(poVar3,"\tEmitVertex();\n");
    poVar3 = std::operator<<(poVar3,"\tEndPrimitive();\n");
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::string::~string((string *)&source_te);
    if (*this_00 - VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST < 2) {
      poVar3 = std::operator<<((ostream *)&source,"\n");
      poVar3 = std::operator<<(poVar3,"\tout_color = in_color[0];\n");
      poVar3 = std::operator<<(poVar3,"\tgl_Position = gl_in[0].gl_Position;\n");
      poVar3 = std::operator<<(poVar3,"\tEmitVertex();\n");
      poVar3 = std::operator<<(poVar3,"\tout_color = in_color[0];\n");
      poVar3 = std::operator<<(poVar3,"\tgl_Position = gl_in[1].gl_Position;\n");
      poVar3 = std::operator<<(poVar3,"\tEmitVertex();\n");
      poVar3 = std::operator<<(poVar3,"\tout_color = in_color[0];\n");
      poVar3 = std::operator<<(poVar3,"\tgl_Position = gl_in[2].gl_Position;\n");
      poVar3 = std::operator<<(poVar3,"\tEmitVertex();\n");
      poVar3 = std::operator<<(poVar3,"\tout_color = in_color[0];\n");
      pcVar2 = "\tgl_Position = vec4(gl_in[2].gl_Position.x, gl_in[1].gl_Position.y, 1.0, 1.0);\n";
    }
    else {
      poVar3 = std::operator<<((ostream *)&source,"\tout_color = in_color[0];\n");
      poVar3 = std::operator<<(poVar3,"\tgl_Position =  vec4(1.0, 1.0, 1.0, 1.0);\n");
      poVar3 = std::operator<<(poVar3,"\tEmitVertex();\n");
      poVar3 = std::operator<<(poVar3,"\tout_color = in_color[0];\n");
      poVar3 = std::operator<<(poVar3,"\tgl_Position = vec4(1.0, -1.0, 1.0, 1.0);\n");
      poVar3 = std::operator<<(poVar3,"\tEmitVertex();\n");
      poVar3 = std::operator<<(poVar3,"\tout_color = in_color[0];\n");
      poVar3 = std::operator<<(poVar3,"\tgl_Position = vec4(-1.0, 1.0, 1.0, 1.0);\n");
      poVar3 = std::operator<<(poVar3,"\tEmitVertex();\n");
      poVar3 = std::operator<<(poVar3,"\tout_color = in_color[0];\n");
    }
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3,"\tEmitVertex();\n");
    std::operator<<(poVar3,"\tEndPrimitive();\n");
    std::operator<<((ostream *)&source,"}\n");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_350,"geometry",(allocator<char> *)&local_328);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&sourceCollections->glslSources,(string *)local_350);
    std::__cxx11::stringbuf::str();
    glu::GeometrySource::GeometrySource((GeometrySource *)&source_te,&local_370);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&source_te);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar3 = std::operator<<((ostream *)&source,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in vec4 in_color;\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 out_color;\n");
  poVar3 = std::operator<<(poVar3,"void main()\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"\tout_color = in_color;\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_350,"fragment",(allocator<char> *)&local_328);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,(string *)local_350);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&source_te,&local_370);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&source_te);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)local_350);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  return;
}

Assistant:

void initPrograms(SourceCollections& sourceCollections) const
	{
		{ // Vertex Shader
			std::ostringstream	source;
			source	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450)<<"\n"
					<< "layout(location = 0) in highp vec4 in_position;\n"
					<< "layout(location = 1) in vec4 in_color;\n"
					<< "layout(location = 0) out vec4 out_color;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = in_position;\n"
					<< "	out_color = in_color;\n"
					<< "}\n";
			sourceCollections.glslSources.add("vertex") << glu::VertexSource(source.str());
		}

		if (m_parametersGraphic.queryStatisticFlags & (VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT|
									VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT))
		{// Tessellation control & evaluation
			std::ostringstream source_tc;
			source_tc	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
						<< "#extension GL_EXT_tessellation_shader : require\n"
						<< "layout(vertices = 4) out;\n"
						<< "layout(location = 0) in vec4 in_color[];\n"
						<< "layout(location = 0) out vec4 out_color[];\n"
						<< "\n"
						<< "void main (void)\n"
						<< "{\n"
						<< "	if( gl_InvocationID == 0 )\n"
						<< "	{\n"
						<< "		gl_TessLevelInner[0] = 4.0f;\n"
						<< "		gl_TessLevelInner[1] = 4.0f;\n"
						<< "		gl_TessLevelOuter[0] = 4.0f;\n"
						<< "		gl_TessLevelOuter[1] = 4.0f;\n"
						<< "		gl_TessLevelOuter[2] = 4.0f;\n"
						<< "		gl_TessLevelOuter[3] = 4.0f;\n"
						<< "	}\n"
						<< "	out_color[gl_InvocationID] = in_color[gl_InvocationID];\n"
						<< "	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
						<< "}\n";
			sourceCollections.glslSources.add("tessellation_control") << glu::TessellationControlSource(source_tc.str());

			std::ostringstream source_te;
			source_te	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
						<< "#extension GL_EXT_tessellation_shader : require\n"
						<< "layout( quads, equal_spacing, ccw ) in;\n"
						<< "layout(location = 0) in vec4 in_color[];\n"
						<< "layout(location = 0) out vec4 out_color;\n"
						<< "void main (void)\n"
						<< "{\n"
						<< "	const float u = gl_TessCoord.x;\n"
						<< "	const float v = gl_TessCoord.y;\n"
						<< "	const float w = gl_TessCoord.z;\n"
						<< "	gl_Position = (1 - u) * (1 - v) * gl_in[0].gl_Position +(1 - u) * v * gl_in[1].gl_Position + u * (1 - v) * gl_in[2].gl_Position + u * v * gl_in[3].gl_Position;\n"
						<< "	out_color = in_color[0];\n"
						<< "}\n";
			sourceCollections.glslSources.add("tessellation_evaluation") << glu::TessellationEvaluationSource(source_te.str());
		}

		if(m_parametersGraphic.queryStatisticFlags & (VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT | VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT |
									VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT | VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT))
		{ // Geometry Shader
			std::ostringstream	source;
			source	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450)<<"\n"
					<< "layout("<<inputTypeToGLString(m_parametersGraphic.primitiveTopology)<<") in;\n"
					<< "layout("<<outputTypeToGLString (m_parametersGraphic.primitiveTopology)<<", max_vertices = 16) out;\n"
					<< "layout(location = 0) in vec4 in_color[];\n"
					<< "layout(location = 0) out vec4 out_color;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	out_color = in_color[0];\n"
					<< "	gl_Position = gl_in[0].gl_Position;\n"
					<< "	EmitVertex();\n"
					<< "	EndPrimitive();\n"
					<< "\n"
					<< "	out_color = in_color[0];\n"
					<< "	gl_Position = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	EmitVertex();\n"
					<< "	out_color = in_color[0];\n"
					<< "	gl_Position = vec4(-1.0, -1.0, 1.0, 1.0);\n"
					<< "	EmitVertex();\n"
					<< "	EndPrimitive();\n"
					<< "\n";
			if (m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP ||
				m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST)
			{
				source	<< "\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = gl_in[0].gl_Position;\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = gl_in[1].gl_Position;\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = gl_in[2].gl_Position;\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = vec4(gl_in[2].gl_Position.x, gl_in[1].gl_Position.y, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	EndPrimitive();\n";
			}
			else
			{
				source	<< "	out_color = in_color[0];\n"
						<< "	gl_Position =  vec4(1.0, 1.0, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = vec4(1.0, -1.0, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = vec4(-1.0, 1.0, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	out_color = in_color[0];\n"
						<< "	gl_Position = vec4(-1.0, -1.0, 1.0, 1.0);\n"
						<< "	EmitVertex();\n"
						<< "	EndPrimitive();\n";
			}
			source	<< "}\n";
			sourceCollections.glslSources.add("geometry") << glu::GeometrySource(source.str());
		}

		{ // Fragment Shader
			std::ostringstream	source;
			source	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450)<<"\n"
					<< "layout(location = 0) in vec4 in_color;\n"
					<< "layout(location = 0) out vec4 out_color;\n"
					<< "void main()\n"
					<<"{\n"
					<< "	out_color = in_color;\n"
					<< "}\n";
			sourceCollections.glslSources.add("fragment") << glu::FragmentSource(source.str());
		}
	}